

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Combine<duckdb::ArgMinMaxState<int,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (ArgMinMaxState<int,_double> *source,ArgMinMaxState<int,_double> *target,
               AggregateInputData *param_3)

{
  bool bVar1;
  undefined8 in_RDX;
  double *in_RSI;
  byte *in_RDI;
  undefined1 x_null;
  
  x_null = (undefined1)((ulong)in_RDX >> 0x38);
  if (((*in_RDI & 1) != 0) &&
     ((((ulong)*in_RSI & 1) == 0 ||
      (bVar1 = duckdb::GreaterThan::Operation<double>((double *)(in_RDI + 8),in_RSI + 1), bVar1))))
  {
    Assign<int,double,duckdb::ArgMinMaxState<int,double>>
              ((ArgMinMaxState<int,_double> *)param_3,(int *)in_RDI,in_RSI,(bool)x_null);
    *(undefined1 *)in_RSI = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}